

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.h
# Opt level: O2

Maybe<kj::StringPtr_&> __thiscall
kj::Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>>::
find<0ul,char_const(&)[7]>
          (Table<kj::StringPtr,kj::HashIndex<kj::_::(anonymous_namespace)::StringHasher>> *this,
          char (*params) [7])

{
  int iVar1;
  long lVar2;
  long lVar3;
  StringHasher *this_00;
  char *pcVar4;
  bool bVar5;
  uint uVar6;
  size_t sVar7;
  long lVar8;
  StringHasher *in_RDX;
  size_t extraout_RDX;
  long lVar9;
  uint uVar10;
  size_t in_R8;
  StringPtr str;
  StringPtr a;
  StringPtr b;
  ulong uVar11;
  
  lVar8 = 0;
  if (*(long *)(params + 8) != 0) {
    lVar2 = *(long *)params;
    sVar7 = strlen((char *)in_RDX);
    str.content.size_ = extraout_RDX;
    str.content.ptr = (char *)(sVar7 + 1);
    uVar6 = _::anon_unknown_0::StringHasher::hashCode(in_RDX,str);
    lVar9 = *(long *)(params + 8);
    uVar10 = (int)lVar9 - 1U & uVar6;
    while( true ) {
      lVar8 = 0;
      uVar11 = (ulong)uVar10;
      lVar3 = *(long *)(params[6] + 6);
      iVar1 = *(int *)(lVar3 + 4 + uVar11 * 8);
      if (iVar1 == 0) break;
      if ((iVar1 != 1) && (*(uint *)(lVar3 + uVar11 * 8) == uVar6)) {
        lVar8 = (ulong)(iVar1 - 2) * 0x10;
        this_00 = *(StringHasher **)(lVar2 + lVar8);
        pcVar4 = *(char **)(lVar2 + 8 + lVar8);
        sVar7 = strlen((char *)in_RDX);
        a.content.size_ = (size_t)in_RDX;
        a.content.ptr = pcVar4;
        b.content.size_ = in_R8;
        b.content.ptr = (char *)(sVar7 + 1);
        bVar5 = _::anon_unknown_0::StringHasher::matches(this_00,a,b);
        if (bVar5) {
          lVar8 = (ulong)(*(int *)(lVar3 + 4 + uVar11 * 8) - 2) * 0x10 + *(long *)params;
          break;
        }
        lVar9 = *(long *)(params + 8);
      }
      uVar10 = (uint)(uVar11 + 1);
      if (uVar11 + 1 == lVar9) {
        uVar10 = 0;
      }
    }
  }
  *(long *)this = lVar8;
  return (Maybe<kj::StringPtr_&>)this;
}

Assistant:

kj::Maybe<Row&> Table<Row, Indexes...>::find(Params&&... params) {
  KJ_IF_SOME(pos, get<index>(indexes).find(rows.asPtr(), kj::fwd<Params>(params)...)) {
    return rows[pos];
  } else {
    return kj::none;
  }
}